

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O1

int ly_utf8_and_equal(char *input,int bytes,...)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint local_d8;
  uint local_b8 [14];
  va_list ap;
  
  puVar4 = (uint *)&stack0x00000008;
  if (0 < bytes) {
    local_d8 = 0x10;
    uVar1 = 0;
    do {
      if (local_d8 < 0x29) {
        uVar2 = (ulong)local_d8;
        local_d8 = local_d8 + 8;
        puVar3 = (uint *)((long)local_b8 + uVar2);
        puVar5 = puVar4;
      }
      else {
        puVar5 = puVar4 + 2;
        puVar3 = puVar4;
      }
      if (local_d8 < 0x29) {
        uVar2 = (ulong)local_d8;
        local_d8 = local_d8 + 8;
        puVar4 = puVar5;
        puVar5 = (uint *)((long)local_b8 + uVar2);
      }
      else {
        puVar4 = puVar5 + 2;
      }
      if ((*puVar3 & (uint)(byte)input[uVar1]) != (uint)(byte)*puVar5) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)bytes != uVar1);
  }
  return 1;
}

Assistant:

static int
ly_utf8_and_equal(const char *input, int bytes, ...)
{
    va_list ap;
    int i, and, byte;

    va_start(ap, bytes);
    for (i = 0; i < bytes; ++i) {
        and = va_arg(ap, int);
        byte = va_arg(ap, int);

        /* compare each byte */
        if (((uint8_t)input[i] & and) != (uint8_t)byte) {
            return 0;
        }
    }
    va_end(ap);

    return 1;
}